

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

pool_ptr<soul::heart::Function> __thiscall soul::Module::Functions::findRunFunction(Functions *this)

{
  size_t in_RSI;
  string_view name;
  
  name._M_str = (char *)0x3;
  name._M_len = in_RSI;
  find(this,name);
  return (pool_ptr<soul::heart::Function>)(Function *)this;
}

Assistant:

pool_ptr<heart::Function> Module::Functions::findRunFunction() const        { return find (heart::getRunFunctionName()); }